

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRErrorCorrectionLevel.cpp
# Opt level: O1

ErrorCorrectionLevel ZXing::QRCode::ECLevelFromBits(int bits,bool isMicro)

{
  ErrorCorrectionLevel *pEVar1;
  undefined3 in_register_00000031;
  
  pEVar1 = (ErrorCorrectionLevel *)(&DAT_001a0200 + (ulong)(bits & 3) * 4);
  if (CONCAT31(in_register_00000031,isMicro) != 0) {
    pEVar1 = (ErrorCorrectionLevel *)(&DAT_001a01e0 + (ulong)(bits & 7) * 4);
  }
  return *pEVar1;
}

Assistant:

ErrorCorrectionLevel ECLevelFromBits(int bits, const bool isMicro)
{
	if (isMicro) {
		constexpr ErrorCorrectionLevel LEVEL_FOR_BITS[] = {
			ErrorCorrectionLevel::Low,    ErrorCorrectionLevel::Low, ErrorCorrectionLevel::Medium, ErrorCorrectionLevel::Low,
			ErrorCorrectionLevel::Medium, ErrorCorrectionLevel::Low, ErrorCorrectionLevel::Medium, ErrorCorrectionLevel::Quality};
		return LEVEL_FOR_BITS[bits & 0x07];
	}
	constexpr ErrorCorrectionLevel LEVEL_FOR_BITS[] = {ErrorCorrectionLevel::Medium, ErrorCorrectionLevel::Low,
													   ErrorCorrectionLevel::High, ErrorCorrectionLevel::Quality};
	return LEVEL_FOR_BITS[bits & 0x3];
}